

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

t_object * __thiscall
xemmai::t_engine::f_allocate_for_type<xemmai::t_type_of<xemmai::io::t_reader>>
          (t_engine *this,size_t a_fields)

{
  ulong a_size;
  t_object *ptVar1;
  long in_FS_OFFSET;
  
  a_size = a_fields * 0x28 + 0x1c0;
  if (a_size < 0x81) {
    ptVar1 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar1 == (t_object *)0x0) {
      ptVar1 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         (&(this->v_object__heap).v_of0,&this->v_object__heap);
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar1->v_next;
  }
  else {
    ptVar1 = t_heap<xemmai::t_object>::f_allocate_medium(&this->v_object__heap,a_size);
  }
  ptVar1->v_next = (t_object *)0x0;
  return ptVar1;
}

Assistant:

t_object* f_allocate_for_type(size_t a_fields)
	{
		return f_allocate(t_object::f_align_for_fields(sizeof(T)) + (sizeof(std::pair<t_slot, t_svalue>) + sizeof(std::pair<t_object*, size_t>)) * a_fields);
	}